

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# read_csv.hpp
# Opt level: O2

void __thiscall
duckdb::SerializedCSVReaderOptions::SerializedCSVReaderOptions(SerializedCSVReaderOptions *this)

{
  CSVReaderOptions::CSVReaderOptions(&this->options);
  MultiFileOptions::MultiFileOptions(&this->file_options);
  return;
}

Assistant:

SerializedCSVReaderOptions() = default;